

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

void __thiscall
Map<unsigned_int,_Error::Private::Str>::~Map(Map<unsigned_int,_Error::Private::Str> *this)

{
  char *pcVar1;
  ItemBlock *pIVar2;
  ItemBlock *pIVar3;
  Item *pIVar4;
  
  for (pIVar4 = (this->_begin).item; pIVar4 != &this->endItem; pIVar4 = pIVar4->next) {
    pcVar1 = (pIVar4->value)._ptr;
    if (pcVar1 != (char *)0x0) {
      operator_delete__(pcVar1);
    }
  }
  pIVar3 = this->blocks;
  while (pIVar3 != (ItemBlock *)0x0) {
    pIVar2 = pIVar3->next;
    operator_delete__(pIVar3);
    pIVar3 = pIVar2;
  }
  pcVar1 = (this->endItem).value._ptr;
  if (pcVar1 == (char *)0x0) {
    return;
  }
  operator_delete__(pcVar1);
  return;
}

Assistant:

~Map()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }